

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O3

bool Assimp::IFC::GenerateOpenings
               (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                *openings,vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *nors,
               TempMesh *curmesh,bool check_intersection,bool generate_connection_geometry,
               IfcVector3 *wall_extrusion_axis)

{
  double *pdVar1;
  element_type *peVar2;
  iterator __position;
  pointer paVar3;
  undefined1 auVar4 [16];
  pointer paVar5;
  pointer paVar6;
  pointer poly_00;
  pointer paVar7;
  bool bVar8;
  IfcVector2 *cp;
  aiMatrix4x4t<double> *paVar9;
  aiVector2t<double> *paVar10;
  undefined7 extraout_var;
  pointer paVar11;
  int iVar12;
  uint uVar13;
  undefined7 in_register_00000009;
  long lVar14;
  IfcMatrix4 *pIVar15;
  TempMesh *pTVar16;
  vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *this;
  undefined7 in_register_00000081;
  TempOpening *__tmp;
  pointer pTVar17;
  uint uVar18;
  pointer pTVar19;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range2_1;
  long lVar20;
  element_type *__x;
  long lVar21;
  iterator __position_00;
  byte bVar22;
  double dVar23;
  pointer paVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  aiVector2t<double> aVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  pointer paVar33;
  bool ok;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> temp_contour;
  ContourVector contours;
  ExPolygons poly;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> temp_contour2;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> profile_verts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> profile_vertcnts;
  OpeningRefVector contours_to_openings;
  IfcVector3 nor;
  BoundingBox newbb;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> contour_flat;
  IfcMatrix4 minv;
  IfcMatrix4 m;
  bool local_421;
  undefined4 local_420;
  undefined4 local_41c;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> local_418;
  undefined4 local_3f4;
  pointer local_3f0;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
  local_3c8;
  ExPolygons local_3a8;
  pointer local_388;
  pointer paStack_380;
  pointer local_378;
  pointer local_368;
  undefined4 local_35c;
  __normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
  local_358;
  __normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
  _Stack_350;
  TempOpening **local_348;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_340;
  pointer local_328;
  double dStack_320;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_310;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  aiVector2t<double> local_2d8;
  vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
  local_2c8;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *local_2b0;
  IfcVector3 local_2a8;
  pointer local_288;
  undefined8 uStack_280;
  double local_278;
  undefined8 uStack_270;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *local_268;
  TempMesh *local_260;
  double local_258;
  double local_250;
  double local_248;
  pointer local_240;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  undefined1 local_218 [128];
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> local_198;
  double local_178;
  double dStack_170;
  undefined1 local_168 [16];
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  IfcMatrix4 local_138;
  IfcMatrix4 local_b8;
  
  bVar22 = 0;
  local_3f4 = (undefined4)CONCAT71(in_register_00000081,generate_connection_geometry);
  local_35c = (undefined4)CONCAT71(in_register_00000009,check_intersection);
  local_2c8.
  super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_421 = true;
  local_198.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.z = 0.0;
  local_2a8.x = 0.0;
  local_2a8.y = 0.0;
  local_2b0 = openings;
  local_268 = nors;
  ProjectOntoPlane(&local_b8,&local_198,curmesh,&local_421,&local_2a8);
  if (local_421 == false) {
    local_420 = 0;
    goto LAB_005b36f9;
  }
  pIVar15 = &local_b8;
  paVar9 = (aiMatrix4x4t<double> *)local_218;
  for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
    paVar9->a1 = pIVar15->a1;
    pIVar15 = (IfcMatrix4 *)((long)pIVar15 + ((ulong)bVar22 * -2 + 1) * 8);
    paVar9 = (aiMatrix4x4t<double> *)((long)paVar9 + (ulong)bVar22 * -0x10 + 8);
  }
  paVar9 = aiMatrix4x4t<double>::Inverse((aiMatrix4x4t<double> *)local_218);
  pIVar15 = &local_138;
  for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
    pIVar15->a1 = paVar9->a1;
    paVar9 = (aiMatrix4x4t<double> *)((long)paVar9 + (ulong)bVar22 * -0x10 + 8);
    pIVar15 = (IfcMatrix4 *)((long)pIVar15 + ((ulong)bVar22 * -2 + 1) * 8);
  }
  local_3c8.
  super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c8.
  super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
  ._M_impl.super__Vector_impl_data._M_start = (ProjectedWindowContour *)0x0;
  local_3c8.
  super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
  ._M_impl.super__Vector_impl_data._M_finish = (ProjectedWindowContour *)0x0;
  local_418.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378 = (pointer)0x0;
  local_388 = (pointer)0x0;
  paStack_380 = (pointer)0x0;
  pTVar17 = (local_2b0->
            super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  pTVar19 = (local_2b0->
            super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar17 == pTVar19) {
LAB_005b36c6:
    local_420 = 0;
  }
  else {
    local_248 = wall_extrusion_axis->x;
    local_250 = wall_extrusion_axis->y;
    dVar26 = wall_extrusion_axis->z;
    local_258 = 1.0 / SQRT(dVar26 * dVar26 + local_248 * local_248 + local_250 * local_250);
    local_248 = local_248 * local_258;
    local_250 = local_250 * local_258;
    local_258 = local_258 * dVar26;
    local_420 = SUB84(local_2b0,0);
    local_368 = pTVar19;
    local_260 = curmesh;
    do {
      dVar26 = (pTVar17->extrusionDir).x;
      dVar28 = (pTVar17->extrusionDir).y;
      dVar30 = (pTVar17->extrusionDir).z;
      dVar32 = dVar30 * dVar30 + dVar26 * dVar26 + dVar28 * dVar28;
      dVar25 = 0.0;
      dVar31 = 0.0;
      dVar23 = 0.0;
      if (1e-10 < dVar32) {
        dVar23 = 1.0 / SQRT(dVar32);
        dVar25 = dVar26 * dVar23;
        dVar31 = dVar28 * dVar23;
        dVar23 = dVar30 * dVar23;
      }
      __x = (pTVar17->profileMesh).
            super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar2 = (pTVar17->profileMesh2D).
               super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_41c = 1;
      if (((peVar2 != (element_type *)0x0) &&
          (0.0 < dVar23 * dVar23 + dVar25 * dVar25 + dVar31 * dVar31)) &&
         (0.9 < ABS(dVar23 * local_2a8.z + dVar25 * local_2a8.x + dVar31 * local_2a8.y))) {
        local_41c = 0;
        __x = peVar2;
      }
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
                (&local_340,&__x->mVerts);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_310,&__x->mVertcnt);
      iVar12 = 3;
      if (2 < (ulong)(((long)local_340.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_340.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))
      {
        if (local_418.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_418.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          local_418.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_418.
               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (paStack_380 != local_388) {
          paStack_380 = local_388;
        }
        paVar33 = (pointer)0xc202a05f20000000;
        paVar24 = (pointer)0x4202a05f20000000;
        local_3e8._8_8_ = 0x4202a05f20000000;
        local_3e8._0_8_ = 0x4202a05f20000000;
        local_2e8._8_8_ = 0x4202a05f20000000;
        local_2e8._0_8_ = 0x4202a05f20000000;
        local_3d8._8_8_ = 0xc202a05f20000000;
        local_3d8._0_8_ = 0xc202a05f20000000;
        local_2f8._8_8_ = 0xc202a05f20000000;
        local_2f8._0_8_ = 0xc202a05f20000000;
        if ((long)local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar21 = (long)local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          local_220 = local_b8.c1;
          local_228 = local_b8.c2;
          local_230 = local_b8.c3;
          local_238 = local_b8.c4;
          local_158 = local_b8.a2;
          dStack_150 = local_b8.b2;
          local_148 = local_b8.a1;
          dStack_140 = local_b8.b1;
          local_168._8_8_ = local_b8.b3;
          local_168._0_8_ = local_b8.a3;
          local_178 = local_b8.a4;
          dStack_170 = local_b8.b4;
          lVar20 = 0;
          lVar14 = 0;
          paVar24 = (pointer)0x4202a05f20000000;
          paVar33 = (pointer)0xc202a05f20000000;
          local_3e8._8_8_ = 0x4202a05f20000000;
          local_3e8._0_8_ = 0x4202a05f20000000;
          local_2e8._8_8_ = 0x4202a05f20000000;
          local_2e8._0_8_ = 0x4202a05f20000000;
          local_3d8._8_8_ = 0xc202a05f20000000;
          local_3d8._0_8_ = 0xc202a05f20000000;
          local_2f8._8_8_ = 0xc202a05f20000000;
          local_2f8._0_8_ = 0xc202a05f20000000;
          local_240 = pTVar17;
          do {
            bVar8 = true;
            if ((byte)local_41c == '\0') {
LAB_005b2c08:
              uVar13 = local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar20];
              if (uVar13 != 0) {
                uVar18 = 0;
                local_3f0 = paVar24;
                local_328 = paVar33;
                do {
                  local_278 = local_340.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar14].x;
                  local_288 = (pointer)local_340.
                                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar14].y;
                  local_2d8.x = local_340.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar14].z;
                  uStack_280 = 0;
                  uStack_270 = 0;
                  local_2d8.y = 0.0;
                  auVar27._0_8_ =
                       local_2d8.x * (double)local_168._0_8_ +
                       local_278 * local_148 + (double)local_288 * local_158 + local_178;
                  auVar27._8_8_ =
                       local_2d8.x * (double)local_168._8_8_ +
                       local_278 * dStack_140 + (double)local_288 * dStack_150 + dStack_170;
                  auVar27 = maxpd(ZEXT816(0),auVar27);
                  local_218._0_16_ = minpd(_DAT_007506a0,auVar27);
                  if (bVar8) {
                    local_3e8 = minpd(local_218._0_16_,local_3e8);
                    local_3d8 = maxpd(local_218._0_16_,local_3d8);
                    this = (vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)
                           &local_418;
                  }
                  else {
                    local_2e8 = minpd(local_218._0_16_,local_2e8);
                    local_2f8 = maxpd(local_218._0_16_,local_2f8);
                    this = (vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)
                           &local_388;
                  }
                  __position._M_current = *(aiVector2t<double> **)(this + 8);
                  for (paVar10 = *(aiVector2t<double> **)this; paVar10 != __position._M_current;
                      paVar10 = paVar10 + 1) {
                    dVar26 = paVar10->x - local_218._0_8_;
                    dVar28 = paVar10->y - local_218._8_8_;
                    if (dVar26 * dVar26 + dVar28 * dVar28 < 9.999999747378752e-06)
                    goto LAB_005b2d8b;
                  }
                  if (__position._M_current == *(aiVector2t<double> **)(this + 0x10)) {
                    std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
                    _M_realloc_insert<aiVector2t<double>const&>
                              (this,__position,(aiVector2t<double> *)local_218);
                  }
                  else {
                    (__position._M_current)->x = local_218._0_8_;
                    (__position._M_current)->y = local_218._8_8_;
                    *(long *)(this + 8) = *(long *)(this + 8) + 0x10;
                  }
LAB_005b2d8b:
                  paVar33 = (pointer)(local_2d8.x * local_230 +
                                      local_278 * local_220 + (double)local_288 * local_228 +
                                     local_238);
                  paVar24 = paVar33;
                  if ((double)local_3f0 <= (double)paVar33) {
                    paVar24 = local_3f0;
                  }
                  if ((double)paVar33 <= (double)local_328) {
                    paVar33 = local_328;
                  }
                  uVar18 = uVar18 + 1;
                  lVar14 = lVar14 + 1;
                  local_3f0 = paVar24;
                  local_328 = paVar33;
                } while (uVar18 != uVar13);
              }
            }
            else {
              dVar30 = local_340.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar14 + 2].x -
                       local_340.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar14].x;
              dVar25 = local_340.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar14 + 2].y -
                       local_340.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar14].y;
              dVar26 = local_340.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar14 + 2].z -
                       local_340.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar14].z;
              dVar31 = local_340.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar14 + 1].x -
                       local_340.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar14].x;
              dVar28 = local_340.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar14 + 1].y -
                       local_340.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar14].y;
              dVar32 = local_340.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar14 + 1].z -
                       local_340.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar14].z;
              dVar23 = dVar25 * dVar32 - dVar28 * dVar26;
              dVar26 = dVar26 * dVar31 - dVar32 * dVar30;
              dVar28 = dVar28 * dVar30 - dVar31 * dVar25;
              dVar30 = 1.0 / SQRT(dVar28 * dVar28 + dVar23 * dVar23 + dVar26 * dVar26);
              dVar26 = dVar30 * dVar28 * local_2a8.z +
                       dVar23 * dVar30 * local_2a8.x + dVar26 * dVar30 * local_2a8.y;
              if (0.9 <= ABS(dVar26)) {
                bVar8 = 0.0 < dVar26;
                goto LAB_005b2c08;
              }
              lVar14 = lVar14 + (ulong)local_310.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar20];
            }
            lVar20 = lVar20 + 1;
            pTVar17 = local_240;
            pTVar19 = local_368;
            curmesh = local_260;
          } while (lVar20 != lVar21 + (ulong)(lVar21 == 0));
        }
        paVar7 = paStack_380;
        paVar6 = local_418.
                 super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        paVar5 = local_418.
                 super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)paStack_380 - (long)local_388) < 0x21) {
          if ((ulong)((long)local_418.
                            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_418.
                           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
            iVar12 = 3;
            goto LAB_005b34f5;
          }
        }
        else {
          if ((byte)local_41c == 0) {
            __assert_fail("!is_2d_source",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                          ,0x508,
                          "bool Assimp::IFC::GenerateOpenings(std::vector<TempOpening> &, const std::vector<IfcVector3> &, TempMesh &, bool, bool, const IfcVector3 &)"
                         );
          }
          if (0x20 < (ulong)((long)local_418.
                                   super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_418.
                                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            if (ABS(((double)local_2f8._0_8_ - (double)local_2e8._0_8_) *
                    ((double)local_2f8._8_8_ - (double)local_2e8._8_8_)) <=
                ABS(((double)local_3d8._0_8_ - (double)local_3e8._0_8_) *
                    ((double)local_3d8._8_8_ - (double)local_3e8._8_8_))) goto LAB_005b2f3d;
          }
          local_418.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = local_388;
          local_418.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = local_378;
          local_388 = paVar5;
          paStack_380 = local_418.
                        super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
          local_378 = paVar6;
          local_3e8 = local_2e8;
          local_3d8 = local_2f8;
          local_418.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = paVar7;
        }
LAB_005b2f3d:
        iVar12 = 3;
        if ((((byte)local_41c & (byte)local_35c) != 1) ||
           ((dVar26 = ABS((double)paVar33 - (double)paVar24) * 0.0001, (double)paVar24 <= dVar26 &&
            (0.0 <= (double)paVar33 + dVar26)))) {
          if (1e-10 <= ABS(((double)local_3d8._8_8_ - (double)local_3e8._8_8_) *
                           ((double)local_3d8._0_8_ - (double)local_3e8._0_8_))) {
            local_358._M_current = (TempOpening **)0x0;
            _Stack_350._M_current = (TempOpening **)0x0;
            local_348 = (TempOpening **)0x0;
            local_358._M_current = (TempOpening **)operator_new(8);
            _Stack_350._M_current = local_358._M_current + 1;
            *local_358._M_current = pTVar17;
            local_3f0 = (pointer)CONCAT44(local_3f0._4_4_,
                                          (int)CONCAT71((int7)((ulong)((long)local_418.
                                                                                                                                                          
                                                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_418.
                                                                                                                
                                                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 8),
                                                  (long)local_418.
                                                                                                                
                                                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_418.
                                                                                                                
                                                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start == 0x40)
                                         );
            __position_00._M_current =
                 local_3c8.
                 super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_348 = _Stack_350._M_current;
            if (local_3c8.
                super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_3c8.
                super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                if ((((double)local_3d8._0_8_ < ((__position_00._M_current)->bb).first.x ||
                      (double)local_3d8._0_8_ == ((__position_00._M_current)->bb).first.x) ||
                    (((__position_00._M_current)->bb).second.x <= (double)local_3e8._0_8_)) ||
                   ((pdVar1 = &((__position_00._M_current)->bb).first.y,
                    (double)local_3d8._8_8_ < *pdVar1 || (double)local_3d8._8_8_ == *pdVar1 ||
                    (((__position_00._M_current)->bb).second.y <= (double)local_3e8._8_8_)))) {
                  __position_00._M_current = __position_00._M_current + 1;
                }
                else {
                  uVar13 = (uint)local_3f0 & 0xff;
                  if ((__position_00._M_current)->is_rectangular == false) {
                    uVar13 = 0;
                  }
                  local_3f0 = (pointer)CONCAT44(local_3f0._4_4_,uVar13);
                  local_3a8.
                  super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_3a8.
                  super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_3a8.
                  super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  MakeDisjunctWindowContours
                            (&(__position_00._M_current)->contour,&local_418,&local_3a8);
                  poly_00 = local_3a8.
                            super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if ((long)local_3a8.
                            super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_3a8.
                            super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                            ._M_impl.super__Vector_impl_data._M_start == 0x30) {
                    GetBoundingBox(&(local_3a8.
                                     super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->outer);
                    aVar29.y = 0.0;
                    aVar29.x = (double)local_218._0_8_;
                    if ((((((__position_00._M_current)->bb).first.x <= (double)local_218._16_8_ &&
                           (double)local_218._16_8_ != ((__position_00._M_current)->bb).first.x) &&
                         ((double)local_218._0_8_ < ((__position_00._M_current)->bb).second.x)) &&
                        (pdVar1 = &((__position_00._M_current)->bb).first.y,
                        *pdVar1 <= (double)local_218._24_8_ && (double)local_218._24_8_ != *pdVar1))
                       && ((double)local_218._8_8_ < ((__position_00._M_current)->bb).second.y))
                    goto LAB_005b3148;
                    local_278 = (double)local_218._24_8_;
                    uStack_270 = 0;
                    local_328 = (pointer)local_218._16_8_;
                    dStack_320 = 0.0;
                    local_288 = (pointer)local_218._8_8_;
                    uStack_280 = 0;
                    local_2d8 = aVar29;
                    ExtractVerticesFromClipper(&poly_00->outer,&local_418,false);
                    local_3e8._8_8_ = local_288;
                    local_3e8._0_8_ = local_2d8.x;
                    local_3d8._8_8_ = local_278;
                    local_3d8._0_8_ = local_328;
                    pTVar19 = local_368;
                  }
                  else {
LAB_005b3148:
                    MergeWindowContours(&local_418,&(__position_00._M_current)->contour,&local_3a8);
                    pTVar19 = local_368;
                    if (1 < (ulong)(((long)local_3a8.
                                           super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_3a8.
                                           super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                   -0x5555555555555555)) {
                      bVar8 = TryAddOpenings_Poly2Tri(local_2b0,local_268,curmesh);
                      local_420 = (undefined4)CONCAT71(extraout_var,bVar8);
                      std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::
                      ~vector(&local_3a8);
                      iVar12 = 1;
                      goto LAB_005b34dd;
                    }
                    if (local_3a8.
                        super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                        ._M_impl.super__Vector_impl_data._M_finish ==
                        local_3a8.
                        super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
                      LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5b3399);
                      if (local_418.
                          super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish !=
                          local_418.
                          super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) {
                        local_418.
                        super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish =
                             local_418.
                             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                      }
                      std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::
                      ~vector(&local_3a8);
                      break;
                    }
                    LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x5b31bc);
                    ExtractVerticesFromClipper
                              (&(local_3a8.
                                 super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->outer,&local_418,false)
                    ;
                    local_328 = (pointer)((__position_00._M_current)->bb).first.x;
                    dStack_320 = ((__position_00._M_current)->bb).first.y;
                    local_2d8 = ((__position_00._M_current)->bb).second;
                    if ((char)local_3f4 != '\0') {
                      lVar14 = ((ulong)((long)__position_00._M_current -
                                       (long)local_3c8.
                                             super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                               0x6276276276276278;
                      std::
                      vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>::
                      _M_range_insert<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening**,std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>>
                                ((vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>
                                  *)&local_358,_Stack_350._M_current,
                                 *(undefined8 *)
                                  ((long)local_2c8.
                                         super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar14),
                                 *(undefined8 *)
                                  ((long)local_2c8.
                                         super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar14 + 8));
                      std::
                      vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                      ::_M_erase(&local_2c8,
                                 (vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                                  *)(((ulong)((long)__position_00._M_current -
                                             (long)local_3c8.
                                                                                                      
                                                  super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                     0x6276276276276278 +
                                    (long)local_2c8.
                                          super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
                    }
                    std::
                    vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                    ::_M_erase(&local_3c8,__position_00);
                    auVar4._8_8_ = dStack_320;
                    auVar4._0_8_ = local_328;
                    local_3e8 = minpd(auVar4,local_3e8);
                    local_3d8 = maxpd((undefined1  [16])local_2d8,local_3d8);
                    __position_00._M_current =
                         local_3c8.
                         super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                  }
                  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::
                  ~vector(&local_3a8);
                }
              } while (__position_00._M_current !=
                       local_3c8.
                       super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            if (local_418.
                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start !=
                local_418.
                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish) {
              if ((char)local_3f4 != '\0') {
                std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>::
                vector<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening**,std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>,void>
                          ((vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>
                            *)local_218,local_358,_Stack_350,(allocator_type *)&local_3a8);
                std::
                vector<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>,std::allocator<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>>
                ::
                emplace_back<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>
                          ((vector<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>,std::allocator<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>>
                            *)&local_2c8,
                           (vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                            *)local_218);
                if ((pointer)local_218._0_8_ != (pointer)0x0) {
                  operator_delete((void *)local_218._0_8_);
                }
              }
              std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::vector
                        ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                         local_218,&local_418);
              local_218[0x60] = (bool)((byte)local_3f0 & 1);
              local_218._24_8_ = local_3e8._0_8_;
              local_218._32_8_ = local_3e8._8_8_;
              local_218._40_8_ = local_3d8._0_8_;
              local_218._48_8_ = local_3d8._8_8_;
              local_218._56_8_ = (_Bit_type *)0x0;
              local_218._64_4_ = 0;
              local_218._72_8_ = (_Bit_type *)0x0;
              local_218._80_4_ = 0;
              local_218._88_8_ = (_Bit_pointer)0x0;
              std::
              vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
              ::emplace_back<Assimp::IFC::ProjectedWindowContour>
                        (&local_3c8,(ProjectedWindowContour *)local_218);
              if ((_Bit_type *)local_218._56_8_ != (_Bit_type *)0x0) {
                operator_delete((void *)local_218._56_8_);
                local_218._56_8_ = (_Bit_type *)0x0;
                local_218._64_4_ = 0;
                local_218._72_8_ = (_Bit_type *)0x0;
                local_218._80_4_ = 0;
                local_218._88_8_ = (_Bit_pointer)0x0;
              }
              if ((pointer)local_218._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_218._0_8_);
              }
            }
            iVar12 = 0;
LAB_005b34dd:
            if (local_358._M_current != (TempOpening **)0x0) {
              operator_delete(local_358._M_current);
            }
          }
        }
      }
LAB_005b34f5:
      if (local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_340.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_340.
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((iVar12 != 0) && (iVar12 != 3)) {
        if (iVar12 != 2) goto LAB_005b36ce;
        break;
      }
      pTVar17 = pTVar17 + 1;
    } while (pTVar17 != pTVar19);
    if (local_3c8.
        super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_3c8.
        super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_005b36c6;
    TempMesh::Clear(curmesh);
    pTVar16 = curmesh;
    Quadrify(&local_3c8,curmesh);
    CleanupWindowContours(&local_3c8);
    InsertWindowContours
              (&local_3c8,
               (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)
               pTVar16,curmesh);
    CleanupOuterContour(&local_198,curmesh);
    paVar3 = (curmesh->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (paVar11 = (curmesh->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start; paVar11 != paVar3;
        paVar11 = paVar11 + 1) {
      dVar26 = paVar11->x;
      dVar28 = paVar11->y;
      dVar30 = paVar11->z;
      paVar11->x = dVar30 * local_138.a3 + dVar26 * local_138.a1 + dVar28 * local_138.a2 +
                   local_138.a4;
      paVar11->y = dVar30 * local_138.b3 + dVar26 * local_138.b1 + dVar28 * local_138.b2 +
                   local_138.b4;
      paVar11->z = local_138.c3 * dVar30 + local_138.c1 * dVar26 + dVar28 * local_138.c2 +
                   local_138.c4;
    }
    local_420 = (undefined4)CONCAT71((int7)((ulong)paVar11 >> 8),1);
    if ((char)local_3f4 != '\0') {
      CloseWindows(&local_3c8,&local_138,&local_2c8,curmesh);
    }
  }
LAB_005b36ce:
  if (local_388 != (pointer)0x0) {
    operator_delete(local_388);
  }
  if (local_418.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_418.
                    super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
  ::~vector(&local_3c8);
LAB_005b36f9:
  if (local_198.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.
                    super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
  ::~vector(&local_2c8);
  return (bool)((byte)local_420 & 1);
}

Assistant:

bool GenerateOpenings(std::vector<TempOpening>& openings,
    const std::vector<IfcVector3>& nors,
    TempMesh& curmesh,
    bool check_intersection,
    bool generate_connection_geometry,
    const IfcVector3& wall_extrusion_axis)
{
    OpeningRefVector contours_to_openings;

    // Try to derive a solid base plane within the current surface for use as
    // working coordinate system. Map all vertices onto this plane and
    // rescale them to [0,1] range. This normalization means all further
    // epsilons need not be scaled.
    bool ok = true;

    std::vector<IfcVector2> contour_flat;

    IfcVector3 nor;
    const IfcMatrix4 m = ProjectOntoPlane(contour_flat, curmesh,  ok, nor);
    if(!ok) {
        return false;
    }

    // Obtain inverse transform for getting back to world space later on
    const IfcMatrix4 minv = IfcMatrix4(m).Inverse();

    // Compute bounding boxes for all 2D openings in projection space
    ContourVector contours;

    std::vector<IfcVector2> temp_contour;
    std::vector<IfcVector2> temp_contour2;

    IfcVector3 wall_extrusion_axis_norm = wall_extrusion_axis;
    wall_extrusion_axis_norm.Normalize();

    for(TempOpening& opening :openings) {

        // extrusionDir may be 0,0,0 on case where the opening mesh is not an
        // IfcExtrudedAreaSolid but something else (i.e. a brep)
        IfcVector3 norm_extrusion_dir = opening.extrusionDir;
        if (norm_extrusion_dir.SquareLength() > 1e-10) {
            norm_extrusion_dir.Normalize();
        }
        else {
            norm_extrusion_dir = IfcVector3();
        }

        TempMesh* profile_data =  opening.profileMesh.get();
        bool is_2d_source = false;
        if (opening.profileMesh2D && norm_extrusion_dir.SquareLength() > 0) {

            if(std::fabs(norm_extrusion_dir * wall_extrusion_axis_norm) < 0.1) {
                // horizontal extrusion
                if (std::fabs(norm_extrusion_dir * nor) > 0.9) {
                    profile_data = opening.profileMesh2D.get();
                    is_2d_source = true;
                }
            }
            else {
                // vertical extrusion
                if (std::fabs(norm_extrusion_dir * nor) > 0.9) {
                    profile_data = opening.profileMesh2D.get();
                    is_2d_source = true;
                }
            }
        }
        std::vector<IfcVector3> profile_verts = profile_data->mVerts;
        std::vector<unsigned int> profile_vertcnts = profile_data->mVertcnt;
        if(profile_verts.size() <= 2) {
            continue;
        }

        // The opening meshes are real 3D meshes so skip over all faces
        // clearly facing into the wrong direction. Also, we need to check
        // whether the meshes do actually intersect the base surface plane.
        // This is done by recording minimum and maximum values for the
        // d component of the plane equation for all polys and checking
        // against surface d.

        // Use the sign of the dot product of the face normal to the plane
        // normal to determine to which side of the difference mesh a
        // triangle belongs. Get independent bounding boxes and vertex
        // sets for both sides and take the better one (we can't just
        // take both - this would likely cause major screwup of vertex
        // winding, producing errors as late as in CloseWindows()).
        IfcFloat dmin, dmax;
        MinMaxChooser<IfcFloat>()(dmin,dmax);

        temp_contour.clear();
        temp_contour2.clear();

        IfcVector2 vpmin,vpmax;
        MinMaxChooser<IfcVector2>()(vpmin,vpmax);

        IfcVector2 vpmin2,vpmax2;
        MinMaxChooser<IfcVector2>()(vpmin2,vpmax2);

        for (size_t f = 0, vi_total = 0, fend = profile_vertcnts.size(); f < fend; ++f) {

            bool side_flag = true;
            if (!is_2d_source) {
                const IfcVector3 face_nor = ((profile_verts[vi_total+2] - profile_verts[vi_total]) ^
                    (profile_verts[vi_total+1] - profile_verts[vi_total])).Normalize();

                const IfcFloat abs_dot_face_nor = std::abs(nor * face_nor);
                if (abs_dot_face_nor < 0.9) {
                    vi_total += profile_vertcnts[f];
                    continue;
                }

                side_flag = nor * face_nor > 0;
            }

            for (unsigned int vi = 0, vend = profile_vertcnts[f]; vi < vend; ++vi, ++vi_total) {
                const IfcVector3& x = profile_verts[vi_total];

                const IfcVector3 v = m * x;
                IfcVector2 vv(v.x, v.y);

                //if(check_intersection) {
                    dmin = std::min(dmin, v.z);
                    dmax = std::max(dmax, v.z);
                //}

                // sanity rounding
                vv = std::max(vv,IfcVector2());
                vv = std::min(vv,one_vec);

                if(side_flag) {
                    vpmin = std::min(vpmin,vv);
                    vpmax = std::max(vpmax,vv);
                }
                else {
                    vpmin2 = std::min(vpmin2,vv);
                    vpmax2 = std::max(vpmax2,vv);
                }

                std::vector<IfcVector2>& store = side_flag ? temp_contour : temp_contour2;

                if (!IsDuplicateVertex(vv, store)) {
                    store.push_back(vv);
                }
            }
        }

        if (temp_contour2.size() > 2) {
            ai_assert(!is_2d_source);
            const IfcVector2 area = vpmax-vpmin;
            const IfcVector2 area2 = vpmax2-vpmin2;
            if (temp_contour.size() <= 2 || std::fabs(area2.x * area2.y) > std::fabs(area.x * area.y)) {
                temp_contour.swap(temp_contour2);

                vpmax = vpmax2;
                vpmin = vpmin2;
            }
        }
        if(temp_contour.size() <= 2) {
            continue;
        }

        // TODO: This epsilon may be too large
        const IfcFloat epsilon = std::fabs(dmax-dmin) * 0.0001;
        if (!is_2d_source && check_intersection && (0 < dmin-epsilon || 0 > dmax+epsilon)) {
            continue;
        }

        BoundingBox bb = BoundingBox(vpmin,vpmax);

        // Skip over very small openings - these are likely projection errors
        // (i.e. they don't belong to this side of the wall)
        if(std::fabs(vpmax.x - vpmin.x) * std::fabs(vpmax.y - vpmin.y) < static_cast<IfcFloat>(1e-10)) {
            continue;
        }
        std::vector<TempOpening*> joined_openings(1, &opening);

        bool is_rectangle = temp_contour.size() == 4;

        // See if this BB intersects or is in close adjacency to any other BB we have so far.
        for (ContourVector::iterator it = contours.begin(); it != contours.end(); ) {
            const BoundingBox& ibb = (*it).bb;

            if (BoundingBoxesOverlapping(ibb, bb)) {

                if (!(*it).is_rectangular) {
                    is_rectangle = false;
                }

                const std::vector<IfcVector2>& other = (*it).contour;
                ClipperLib::ExPolygons poly;

                // First check whether subtracting the old contour (to which ibb belongs)
                // from the new contour (to which bb belongs) yields an updated bb which
                // no longer overlaps ibb
                MakeDisjunctWindowContours(other, temp_contour, poly);
                if(poly.size() == 1) {

                    const BoundingBox newbb = GetBoundingBox(poly[0].outer);
                    if (!BoundingBoxesOverlapping(ibb, newbb )) {
                         // Good guy bounding box
                         bb = newbb ;

                         ExtractVerticesFromClipper(poly[0].outer, temp_contour, false);
                         continue;
                    }
                }

                // Take these two overlapping contours and try to merge them. If they
                // overlap (which should not happen, but in fact happens-in-the-real-
                // world [tm] ), resume using a single contour and a single bounding box.
                MergeWindowContours(temp_contour, other, poly);

                if (poly.size() > 1) {
                    return TryAddOpenings_Poly2Tri(openings, nors, curmesh);
                }
                else if (poly.size() == 0) {
                    IFCImporter::LogWarn("ignoring duplicate opening");
                    temp_contour.clear();
                    break;
                }
                else {
                    IFCImporter::LogDebug("merging overlapping openings");
                    ExtractVerticesFromClipper(poly[0].outer, temp_contour, false);

                    // Generate the union of the bounding boxes
                    bb.first = std::min(bb.first, ibb.first);
                    bb.second = std::max(bb.second, ibb.second);

                    // Update contour-to-opening tables accordingly
                    if (generate_connection_geometry) {
                        std::vector<TempOpening*>& t = contours_to_openings[std::distance(contours.begin(),it)];
                        joined_openings.insert(joined_openings.end(), t.begin(), t.end());

                        contours_to_openings.erase(contours_to_openings.begin() + std::distance(contours.begin(),it));
                    }

                    contours.erase(it);

                    // Restart from scratch because the newly formed BB might now
                    // overlap any other BB which its constituent BBs didn't
                    // previously overlap.
                    it = contours.begin();
                    continue;
                }
            }
            ++it;
        }

        if(!temp_contour.empty()) {
            if (generate_connection_geometry) {
                contours_to_openings.push_back(std::vector<TempOpening*>(
                    joined_openings.begin(),
                    joined_openings.end()));
            }

            contours.push_back(ProjectedWindowContour(temp_contour, bb, is_rectangle));
        }
    }

    // Check if we still have any openings left - it may well be that this is
    // not the cause, for example if all the opening candidates don't intersect
    // this surface or point into a direction perpendicular to it.
    if (contours.empty()) {
        return false;
    }

    curmesh.Clear();

    // Generate a base subdivision into quads to accommodate the given list
    // of window bounding boxes.
    Quadrify(contours,curmesh);

    // Run a sanity cleanup pass on the window contours to avoid generating
    // artifacts during the contour generation phase later on.
    CleanupWindowContours(contours);

    // Previously we reduced all windows to rectangular AABBs in projection
    // space, now it is time to fill the gaps between the BBs and the real
    // window openings.
    InsertWindowContours(contours,openings, curmesh);

    // Clip the entire outer contour of our current result against the real
    // outer contour of the surface. This is necessary because the result
    // of the Quadrify() algorithm is always a square area spanning
    // over [0,1]^2 (i.e. entire projection space).
    CleanupOuterContour(contour_flat, curmesh);

    // Undo the projection and get back to world (or local object) space
    for(IfcVector3& v3 : curmesh.mVerts) {
        v3 = minv * v3;
    }

    // Generate window caps to connect the symmetric openings on both sides
    // of the wall.
    if (generate_connection_geometry) {
        CloseWindows(contours, minv, contours_to_openings, curmesh);
    }
    return true;
}